

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O1

PipelineResourceSignatureInternalDataVk * __thiscall
Diligent::PipelineResourceSignatureVkImpl::GetInternalData
          (PipelineResourceSignatureInternalDataVk *__return_storage_ptr__,
          PipelineResourceSignatureVkImpl *this)

{
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).ShaderStages = SHADER_TYPE_UNKNOWN;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).StaticResShaderStages = SHADER_TYPE_UNKNOWN;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).PipelineType = PIPELINE_TYPE_INVALID;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).ShaderStages =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_ShaderStages;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).StaticResShaderStages =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
       m_StaticResShaderStages;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).PipelineType =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_PipelineType;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
           ).pResourceAttribs + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
           ).pImmutableSamplers + 4) = 0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
    )._Padding = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->
           super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
           ).NumImmutableSamplers + 3) = 0;
  *(undefined4 *)
   (__return_storage_ptr__->
   super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
   ).StaticResStageIndex._M_elems =
       *(undefined4 *)
        (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
        m_StaticResStageIndex._M_elems;
  *(undefined2 *)
   ((__return_storage_ptr__->
    super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
    ).StaticResStageIndex._M_elems + 4) =
       *(undefined2 *)
        ((this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
         m_StaticResStageIndex._M_elems + 4);
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pResourceAttribs =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).m_pResourceAttribs;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumResources =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       .m_Desc.NumResources;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).pImmutableSamplers =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
       m_pImmutableSamplerAttribs;
  (__return_storage_ptr__->
  super_PipelineResourceSignatureInternalData<Diligent::PipelineResourceAttribsVk,_Diligent::ImmutableSamplerAttribsVk>
  ).NumImmutableSamplers =
       (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
       super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
       .m_Desc.NumImmutableSamplers;
  __return_storage_ptr__->DynamicStorageBufferCount = this->m_DynamicStorageBufferCount;
  __return_storage_ptr__->DynamicUniformBufferCount = this->m_DynamicUniformBufferCount;
  return __return_storage_ptr__;
}

Assistant:

PipelineResourceSignatureInternalDataVk PipelineResourceSignatureVkImpl::GetInternalData() const
{
    PipelineResourceSignatureInternalDataVk InternalData = TPipelineResourceSignatureBase::GetInternalData();

    InternalData.DynamicStorageBufferCount = m_DynamicStorageBufferCount;
    InternalData.DynamicUniformBufferCount = m_DynamicUniformBufferCount;

    return InternalData;
}